

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O2

int __thiscall
booster::locale::impl_std::utf8_collator_from_wide::do_compare
          (utf8_collator_from_wide *this,char *lb,char *le,char *rb,char *re)

{
  int iVar1;
  collate *pcVar2;
  wstring r;
  wstring l;
  allocator local_89;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_88;
  string local_68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  
  std::__cxx11::string::string((string *)&local_88,"UTF-8",(allocator *)&local_68);
  conv::to_utf<wchar_t>(&local_48,lb,le,(string *)&local_88,default_method);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_68,"UTF-8",&local_89);
  conv::to_utf<wchar_t>(&local_88,rb,re,&local_68,default_method);
  std::__cxx11::string::~string((string *)&local_68);
  pcVar2 = std::use_facet<std::__cxx11::collate<wchar_t>>(&this->base_);
  iVar1 = (**(code **)(*(long *)pcVar2 + 0x10))
                    (pcVar2,local_48._M_dataplus._M_p,
                     local_48._M_dataplus._M_p + local_48._M_string_length,local_88._M_dataplus._M_p
                     ,local_88._M_dataplus._M_p + local_88._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)&local_88);
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  return iVar1;
}

Assistant:

virtual int do_compare(char const *lb,char const *le,char const *rb,char const *re) const
    {
        std::wstring l=conv::to_utf<wchar_t>(lb,le,"UTF-8");
        std::wstring r=conv::to_utf<wchar_t>(rb,re,"UTF-8");
        return std::use_facet<wfacet>(base_).compare(   l.c_str(),l.c_str()+l.size(),
                                                        r.c_str(),r.c_str()+r.size());
    }